

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureMultisampleTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::MultisampleTextureUsageCase::iterate
          (MultisampleTextureUsageCase *this)

{
  ostringstream *poVar1;
  int iVar2;
  TestLog *pTVar3;
  RenderContext *context;
  int iVar4;
  uint uVar5;
  int iVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  deUint32 dVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ObjectTraits *pOVar13;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  RenderTarget *pRVar14;
  Surface *surface;
  void *__buf;
  char *description;
  qpTestResult qVar15;
  float fVar16;
  float fVar17;
  Surface result;
  Buffer vertexAttibBuffer;
  ScopedLogSection section;
  Random rnd;
  float clearColor [4];
  float local_2c0;
  Surface local_2b8;
  undefined4 local_29c;
  string local_298;
  LogImageSet local_278;
  ScopedLogSection local_238;
  string local_230;
  ulong local_210;
  string local_208;
  string local_1e8;
  deRandom local_1c8;
  undefined1 local_1b8 [32];
  _Alloc_hider local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188 [4];
  ios_base local_140 [272];
  long lVar12;
  
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_1b8._0_8_ = (long)local_1b8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"Sample","");
  local_278.m_name._M_dataplus._M_p = (pointer)&local_278.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_278,"Render to texture and sample texture","");
  tcu::ScopedLogSection::ScopedLogSection(&local_238,pTVar3,(string *)local_1b8,&local_278.m_name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278.m_name._M_dataplus._M_p != &local_278.m_name.field_2) {
    operator_delete(local_278.m_name._M_dataplus._M_p,
                    CONCAT44(local_278.m_name.field_2._M_allocated_capacity._4_4_,
                             local_278.m_name.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if (local_1b8._0_8_ != (long)local_1b8 + 0x10) {
    operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
  }
  tcu::Surface::Surface(&local_2b8,0x100,0x100);
  fVar16 = 0.0;
  if ((this->m_isColorFormat == false) && (this->m_isDepthFormat == false)) {
    if (this->m_isSignedFormat == false) {
      if (this->m_isUnsignedFormat == false) {
        fVar16 = 1.0;
      }
    }
    else {
      fVar16 = -100.0;
    }
  }
  local_2c0 = 1.0;
  if ((this->m_isColorFormat == false) && (this->m_isDepthFormat == false)) {
    if (this->m_isSignedFormat == false) {
      if (this->m_isUnsignedFormat == false) {
        local_2c0 = -1.0;
      }
      else {
        local_2c0 = 200.0;
      }
    }
    else {
      local_2c0 = 100.0;
    }
  }
  uVar5 = (this->m_type >> 0x10 ^ this->m_type ^ 0x3d) * 9;
  uVar5 = (uVar5 >> 4 ^ uVar5) * 0x27d4eb2d;
  deRandom_init(&local_1c8,uVar5 >> 0xf ^ uVar5);
  fVar17 = deRandom_getFloat(&local_1c8);
  local_2c0 = (local_2c0 - fVar16) * fVar17 + fVar16;
  if ((this->m_isSignedFormat != false) || (this->m_isUnsignedFormat == true)) {
    local_2c0 = floorf(local_2c0);
  }
  if ((anonymous_namespace)::MultisampleTextureUsageCase::renderToTexture(float)::fullscreenQuad ==
      '\0') {
    _GLOBAL__N_1::MultisampleTextureUsageCase::iterate();
  }
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar12 = CONCAT44(extraout_var,iVar6);
  uVar7 = (**(code **)(lVar12 + 0x780))((this->m_drawShader->m_program).m_program,"a_position");
  uVar8 = (**(code **)(lVar12 + 0xb48))((this->m_drawShader->m_program).m_program,"u_writeValue");
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  pOVar13 = glu::objectTraits(OBJECTTYPE_BUFFER);
  glu::ObjectWrapper::ObjectWrapper
            ((ObjectWrapper *)&local_278,(Functions *)CONCAT44(extraout_var_00,iVar6),pOVar13);
  local_1b8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1b8 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Filling multisample texture with value ",0x27);
  std::ostream::_M_insert<double>((double)local_2c0);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_140);
  (**(code **)(lVar12 + 0x40))(0x8892,local_278.m_name.field_2._M_allocated_capacity._0_4_);
  (**(code **)(lVar12 + 0x150))
            (0x8892,0x40,
             (anonymous_namespace)::MultisampleTextureUsageCase::renderToTexture(float)::
             fullscreenQuad,0x88e4);
  dVar9 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar9,"bufferdata",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                  ,0x577);
  (**(code **)(lVar12 + 0x78))(0x8d40,this->m_fboID);
  (**(code **)(lVar12 + 0x1a00))(0,0,0x100,0x100);
  if (this->m_isColorFormat == true) {
    local_1b8._0_4_ = R;
    local_1b8._4_4_ = SNORM_INT8;
    local_1b8._8_8_ = 0;
    (**(code **)(lVar12 + 0x1a8))(0x1800,0);
  }
  else if (this->m_isSignedFormat == true) {
    local_1b8._0_4_ = R;
    local_1b8._4_4_ = SNORM_INT8;
    local_1b8._8_8_ = 0;
    (**(code **)(lVar12 + 0x1b0))(0x1800,0);
  }
  else if (this->m_isUnsignedFormat == true) {
    local_1b8._0_4_ = R;
    local_1b8._4_4_ = SNORM_INT8;
    local_1b8._8_8_ = 0;
    (**(code **)(lVar12 + 0x1b8))(0x1800,0);
  }
  else if (this->m_isDepthFormat == true) {
    local_1b8._0_4_ = 0x3f000000;
    (**(code **)(lVar12 + 0x1a8))(0x1801,0);
  }
  dVar9 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar9,"clear buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                  ,0x593);
  (**(code **)(lVar12 + 0x19f0))(uVar7,4,0x1406,0,0,0);
  (**(code **)(lVar12 + 0x610))(uVar7);
  (**(code **)(lVar12 + 0x1680))((this->m_drawShader->m_program).m_program);
  (**(code **)(lVar12 + 0x14e0))(local_2c0,uVar8);
  dVar9 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar9,"setup draw",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                  ,0x59d);
  if (this->m_isDepthFormat == true) {
    (**(code **)(lVar12 + 0x5e0))(0xb71);
    (**(code **)(lVar12 + 0x4a0))(0x207);
  }
  (**(code **)(lVar12 + 0x538))(5,0,4);
  dVar9 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar9,"draw",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                  ,0x5a6);
  if (this->m_isDepthFormat == true) {
    (**(code **)(lVar12 + 0x4e8))(0xb71);
  }
  (**(code **)(lVar12 + 0x518))(uVar7);
  (**(code **)(lVar12 + 0x1680))(0);
  (**(code **)(lVar12 + 0x78))(0x8d40,0);
  dVar9 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar9,"clean",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                  ,0x5b0);
  glu::ObjectWrapper::~ObjectWrapper((ObjectWrapper *)&local_278);
  if ((anonymous_namespace)::MultisampleTextureUsageCase::sampleTexture(tcu::Surface&,float)::
      fullscreenQuad == '\0') {
    _GLOBAL__N_1::MultisampleTextureUsageCase::iterate();
  }
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar12 = CONCAT44(extraout_var_01,iVar6);
  uVar7 = (**(code **)(lVar12 + 0x780))((this->m_samplerShader->m_program).m_program,"a_position");
  uVar8 = (**(code **)(lVar12 + 0xb48))((this->m_samplerShader->m_program).m_program,"u_sampler");
  uVar10 = (**(code **)(lVar12 + 0xb48))
                     ((this->m_samplerShader->m_program).m_program,"u_maxSamples");
  local_29c = (**(code **)(lVar12 + 0xb48))((this->m_samplerShader->m_program).m_program,"u_layer");
  uVar11 = (**(code **)(lVar12 + 0xb48))((this->m_samplerShader->m_program).m_program,"u_cmpValue");
  local_210 = (ulong)this->m_isArrayType;
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  pOVar13 = glu::objectTraits(OBJECTTYPE_BUFFER);
  glu::ObjectWrapper::ObjectWrapper
            ((ObjectWrapper *)&local_278,(Functions *)CONCAT44(extraout_var_02,iVar6),pOVar13);
  local_1b8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1b8 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Sampling from texture.",0x16);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_140);
  (**(code **)(lVar12 + 0x40))(0x8892,local_278.m_name.field_2._M_allocated_capacity._0_4_);
  (**(code **)(lVar12 + 0x150))
            (0x8892,0x40,
             (anonymous_namespace)::MultisampleTextureUsageCase::sampleTexture(tcu::Surface&,float)
             ::fullscreenQuad,0x88e4);
  dVar9 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar9,"bufferdata",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                  ,0x5cc);
  (**(code **)(lVar12 + 0x1a00))(0,0,0x100,0x100);
  (**(code **)(lVar12 + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(lVar12 + 0x188))(0x4000);
  (**(code **)(lVar12 + 0x19f0))(uVar7,4,0x1406,0,0,0);
  (**(code **)(lVar12 + 0x610))(uVar7);
  (**(code **)(lVar12 + 0x1680))((this->m_samplerShader->m_program).m_program);
  (**(code **)(lVar12 + 0x14f0))(uVar8,0);
  (**(code **)(lVar12 + 0x14f0))(uVar10,this->m_numSamples);
  if (this->m_isArrayType == true) {
    (**(code **)(lVar12 + 0x14f0))(local_29c,3);
  }
  (**(code **)(lVar12 + 0x14e0))(local_2c0,uVar11);
  (**(code **)(lVar12 + 0xb8))((int)local_210 * 2 + 0x9100,this->m_textureID);
  dVar9 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar9,"setup draw",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                  ,0x5e0);
  (**(code **)(lVar12 + 0x538))(5,0,4);
  dVar9 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar9,"draw",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                  ,0x5e3);
  (**(code **)(lVar12 + 0x518))(uVar7);
  (**(code **)(lVar12 + 0x1680))(0);
  dVar9 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar9,"clean",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                  ,0x5e9);
  (**(code **)(lVar12 + 0x648))();
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  local_298._M_dataplus._M_p = (char *)0x300000008;
  if ((void *)local_2b8.m_pixels.m_cap != (void *)0x0) {
    local_2b8.m_pixels.m_cap = (size_t)local_2b8.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1b8,(TextureFormat *)&local_298,local_2b8.m_width,
             local_2b8.m_height,1,(void *)local_2b8.m_pixels.m_cap);
  glu::readPixels(context,0,0,(PixelBufferAccess *)local_1b8);
  glu::ObjectWrapper::~ObjectWrapper((ObjectWrapper *)&local_278);
  local_1b8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1b8 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Verifying image.",0x10);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_140);
  qVar15 = QP_TEST_RESULT_PASS;
  local_2c0 = (float)qVar15;
  if (0 < local_2b8.m_height) {
    local_2c0 = 0.0;
    do {
      if (0 < local_2b8.m_width) {
        iVar6 = 0;
        do {
          uVar5 = *(uint *)((long)local_2b8.m_pixels.m_ptr +
                           (long)(int)(local_2b8.m_width * qVar15 + iVar6) * 4);
          pRVar14 = Context::getRenderTarget((this->super_TestCase).m_context);
          iVar4 = (pRVar14->m_pixelFormat).redBits;
          pRVar14 = Context::getRenderTarget((this->super_TestCase).m_context);
          iVar2 = (pRVar14->m_pixelFormat).greenBits;
          pRVar14 = Context::getRenderTarget((this->super_TestCase).m_context);
          if (((1 << (8U - (char)iVar4 & 0x1f) < (int)(uVar5 & 0xff)) ||
              ((int)(uVar5 >> 8 & 0xff) < (-1 << (8U - (char)iVar2 & 0x1f)) + 0xff)) ||
             (1 << (8U - (char)(pRVar14->m_pixelFormat).blueBits & 0x1f) <
              (int)(uVar5 >> 0x10 & 0xff))) {
            local_2c0 = 1.4013e-45;
          }
          iVar6 = iVar6 + 1;
        } while (iVar6 < local_2b8.m_width);
      }
      qVar15 = qVar15 + QP_TEST_RESULT_FAIL;
    } while ((int)qVar15 < local_2b8.m_height);
  }
  if (local_2c0 == 0.0) {
    local_1b8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"No invalid pixels found.",0x18);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_140);
    description = "Pass";
  }
  else {
    local_1b8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Invalid pixels found.",0x15);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_140);
    pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    local_1b8._0_4_ = S;
    local_1b8._4_4_ = SNORM_INT8;
    local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
    local_298._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_298,(ulong)local_1b8);
    local_298.field_2._M_allocated_capacity = local_1b8._0_8_;
    builtin_strncpy(local_298._M_dataplus._M_p,"Verification result",0x13);
    local_298._M_string_length = local_1b8._0_8_;
    local_298._M_dataplus._M_p[local_1b8._0_8_] = '\0';
    local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
    local_1b8._0_4_ = S;
    local_1b8._4_4_ = SNORM_INT8;
    local_230._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_230,(ulong)local_1b8);
    local_230.field_2._M_allocated_capacity = local_1b8._0_8_;
    builtin_strncpy(local_230._M_dataplus._M_p,"Result of rendering",0x13);
    local_230._M_string_length = local_1b8._0_8_;
    local_230._M_dataplus._M_p[local_1b8._0_8_] = '\0';
    tcu::LogImageSet::LogImageSet(&local_278,&local_298,&local_230);
    tcu::TestLog::startImageSet
              (pTVar3,local_278.m_name._M_dataplus._M_p,local_278.m_description._M_dataplus._M_p);
    local_1e8.field_2._M_allocated_capacity._0_4_ = 0x75736552;
    local_1e8.field_2._M_allocated_capacity._4_2_ = 0x746c;
    local_1e8._M_string_length = 6;
    local_1e8.field_2._M_local_buf[6] = '\0';
    local_208.field_2._M_allocated_capacity._0_4_ = 0x75736552;
    local_208.field_2._M_allocated_capacity._4_2_ = 0x746c;
    local_208._M_string_length = 6;
    local_208.field_2._M_local_buf[6] = '\0';
    surface = &local_2b8;
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    tcu::LogImage::LogImage
              ((LogImage *)local_1b8,&local_1e8,&local_208,surface,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)local_1b8,(int)pTVar3,__buf,(size_t)surface);
    tcu::TestLog::endImageSet(pTVar3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_p != local_188) {
      operator_delete(local_198._M_p,local_188[0]._M_allocated_capacity + 1);
    }
    if (local_1b8._0_8_ != (long)local_1b8 + 0x10) {
      operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,
                      CONCAT17(local_208.field_2._M_local_buf[7],
                               CONCAT16(local_208.field_2._M_local_buf[6],
                                        CONCAT24(local_208.field_2._M_allocated_capacity._4_2_,
                                                 local_208.field_2._M_allocated_capacity._0_4_))) +
                      1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,
                      CONCAT17(local_1e8.field_2._M_local_buf[7],
                               CONCAT16(local_1e8.field_2._M_local_buf[6],
                                        CONCAT24(local_1e8.field_2._M_allocated_capacity._4_2_,
                                                 local_1e8.field_2._M_allocated_capacity._0_4_))) +
                      1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278.m_description._M_dataplus._M_p != &local_278.m_description.field_2) {
      operator_delete(local_278.m_description._M_dataplus._M_p,
                      local_278.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278.m_name._M_dataplus._M_p != &local_278.m_name.field_2) {
      operator_delete(local_278.m_name._M_dataplus._M_p,
                      CONCAT44(local_278.m_name.field_2._M_allocated_capacity._4_4_,
                               local_278.m_name.field_2._M_allocated_capacity._0_4_) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p,
                      (ulong)(local_230.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != &local_298.field_2) {
      operator_delete(local_298._M_dataplus._M_p,
                      (ulong)(local_298.field_2._M_allocated_capacity + 1));
    }
    description = "Image verification failed";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(qpTestResult)local_2c0,
             description);
  tcu::Surface::~Surface(&local_2b8);
  tcu::TestLog::endSection(local_238.m_log);
  return STOP;
}

Assistant:

MultisampleTextureUsageCase::IterateResult MultisampleTextureUsageCase::iterate (void)
{
	const tcu::ScopedLogSection	section			(m_testCtx.getLog(), "Sample", "Render to texture and sample texture");
	tcu::Surface				result			(s_textureSize, s_textureSize);
	const float					minValue		= (m_isColorFormat || m_isDepthFormat) ? (0.0f) : (m_isSignedFormat) ? (-100.0f) : (m_isUnsignedFormat) ? (0.0f)	: ( 1.0f);
	const float					maxValue		= (m_isColorFormat || m_isDepthFormat) ? (1.0f) : (m_isSignedFormat) ? ( 100.0f) : (m_isUnsignedFormat) ? (200.0f)	: (-1.0f);
	de::Random					rnd				(deUint32Hash((deUint32)m_type));
	const float					rawValue		= rnd.getFloat(minValue, maxValue);
	const float					preparedValue	= (m_isSignedFormat || m_isUnsignedFormat) ? (deFloatFloor(rawValue)) : (rawValue);

	// draw to fbo with a random value

	renderToTexture(preparedValue);

	// draw from texture to front buffer

	sampleTexture(result, preparedValue);

	// result is ok?

	if (verifyImage(result))
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image verification failed");

	return STOP;
}